

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdn.cpp
# Opt level: O3

bool __thiscall DSDcc::DSDNXDN::UDCH::decode(UDCH *this)

{
  bool bVar1;
  long lVar2;
  CNXDNConvolution conv;
  CNXDNConvolution CStack_48;
  
  CNXDNConvolution::CNXDNConvolution(&CStack_48);
  CNXDNConvolution::start(&CStack_48);
  lVar2 = 0;
  do {
    CNXDNConvolution::decode(&CStack_48,this->m_temp[lVar2 * 2],this->m_temp[lVar2 * 2 + 1]);
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 0xcf);
  CNXDNConvolution::chainback(&CStack_48,this->m_data,0xcb);
  bVar1 = CNXDNCRC::checkCRC15(this->m_data,0xb8);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DSDNXDN::UDCH::decode: bad CRC",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  CNXDNConvolution::~CNXDNConvolution(&CStack_48);
  return bVar1;
}

Assistant:

bool DSDNXDN::UDCH::decode()
{
    CNXDNConvolution conv;
    conv.start();
    int n = 0;

    for (unsigned int i = 0U; i < 207U; i++)
    {
        uint8_t s0 = m_temp[n++];
        uint8_t s1 = m_temp[n++];

        conv.decode(s0, s1);
    }

    conv.chainback(m_data, 203U);

    if (!CNXDNCRC::checkCRC15(m_data, 184))
    {
        std::cerr << "DSDNXDN::UDCH::decode: bad CRC" << std::endl;
        return false;
    }
    else
    {
        return true;
    }
}